

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_test_util.cc
# Opt level: O3

int __thiscall
ctemplate::TemplateDictionaryPeer::GetIncludeDictionaries
          (TemplateDictionaryPeer *this,TemplateString *section_name,
          vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
          *dicts)

{
  iterator __position;
  char cVar1;
  int iVar2;
  long *plVar3;
  TemplateDictionary *local_20;
  
  if (*(long *)(dicts + 8) != *(long *)dicts) {
    *(long *)(dicts + 8) = *(long *)dicts;
  }
  cVar1 = (**(code **)(*(long *)this->dict_ + 0x28))(this->dict_,section_name);
  iVar2 = 0;
  if (cVar1 == '\0') {
    plVar3 = (long *)(**(code **)(*(long *)this->dict_ + 0x38))(this->dict_,section_name);
    cVar1 = (**(code **)(*plVar3 + 0x10))(plVar3);
    if (cVar1 != '\0') {
      do {
        local_20 = (TemplateDictionary *)(**(code **)(*plVar3 + 0x18))(plVar3);
        __position._M_current = *(TemplateDictionary ***)(dicts + 8);
        if (__position._M_current == *(TemplateDictionary ***)(dicts + 0x10)) {
          std::
          vector<ctemplate::TemplateDictionary_const*,std::allocator<ctemplate::TemplateDictionary_const*>>
          ::_M_realloc_insert<ctemplate::TemplateDictionary_const*>
                    ((vector<ctemplate::TemplateDictionary_const*,std::allocator<ctemplate::TemplateDictionary_const*>>
                      *)dicts,__position,&local_20);
        }
        else {
          *__position._M_current = local_20;
          *(long *)(dicts + 8) = *(long *)(dicts + 8) + 8;
        }
        cVar1 = (**(code **)(*plVar3 + 0x10))(plVar3);
      } while (cVar1 != '\0');
    }
    (**(code **)(*plVar3 + 8))(plVar3);
    iVar2 = (int)((ulong)(*(long *)(dicts + 8) - *(long *)dicts) >> 3);
  }
  return iVar2;
}

Assistant:

int TemplateDictionaryPeer::GetIncludeDictionaries(
    const TemplateString& section_name,
    vector<const TemplateDictionary*>* dicts) const {
  dicts->clear();
  if (dict_->IsHiddenTemplate(section_name))
    return 0;

  TemplateDictionaryInterface::Iterator* di =
      dict_->CreateTemplateIterator(section_name);
  while (di->HasNext())
    dicts->push_back(down_cast<const TemplateDictionary*>(&di->Next()));
  delete di;

  return static_cast<int>(dicts->size());
}